

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.h
# Opt level: O2

void __thiscall ObjTypeSpecFldInfo::SetFieldValue(ObjTypeSpecFldInfo *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = IsMono(this);
  if (!bVar2) {
    bVar2 = IsPoly(this);
    if (bVar2) {
      bVar2 = DoesntHaveEquivalence(this);
      if (!bVar2) goto LAB_0059405d;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.h"
                       ,0xa8,"(IsMono() || (IsPoly() && !DoesntHaveEquivalence()))",
                       "IsMono() || (IsPoly() && !DoesntHaveEquivalence())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
LAB_0059405d:
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            (&((this->m_data).fixedFieldInfoArray.ptr)->fieldValue,value);
  return;
}

Assistant:

void SetFieldValue(Js::Var value)
    {
        Assert(IsMono() || (IsPoly() && !DoesntHaveEquivalence()));
        m_data.fixedFieldInfoArray[0].fieldValue = value;
    }